

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall QAbstractItemView::mouseDoubleClickEvent(QAbstractItemView *this,QMouseEvent *event)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  long lVar4;
  bool bVar5;
  char cVar6;
  undefined4 uVar7;
  int iVar8;
  ulong uVar9;
  undefined8 uVar10;
  QStyle *pQVar11;
  long in_FS_OFFSET;
  QPointF QVar12;
  qreal local_d8;
  qreal local_d0;
  qreal local_c8;
  qreal local_c0;
  QPersistentModelIndex persistent;
  QMouseEvent me;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = *(long *)(this + 8);
  local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QVar12 = QSinglePointEvent::position((QSinglePointEvent *)event);
  _me = (undefined1 *)QVar12.xp;
  persistent.d = (QPersistentModelIndexData *)QPointF::toPoint((QPointF *)&me);
  (**(code **)(*(long *)this + 0x1f0))(&local_58,this);
  if (((-1 < (int)local_58) && (-1 < (long)local_58)) && (local_48.ptr != (QAbstractItemModel *)0x0)
     ) {
    uVar9 = (**(code **)(**(long **)(lVar4 + 0x2f8) + 0x138))(*(long **)(lVar4 + 0x2f8),&local_58);
    if ((uVar9 & 0x20) != 0) {
      bVar5 = ::operator!=((QPersistentModelIndex *)(lVar4 + 0x380),(QModelIndex *)&local_58);
      if (!bVar5) {
        persistent.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
        QPersistentModelIndex::QPersistentModelIndex(&persistent,(QModelIndex *)&local_58);
        QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&me,&persistent);
        doubleClicked(this,(QModelIndex *)&me);
        if (*(int *)(event + 0x40) == 1) {
          QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&me,&persistent);
          cVar6 = (**(code **)(*(long *)this + 0x2e0))(this,(QModelIndex *)&me,2,event);
          if (cVar6 == '\0') {
            pQVar11 = QWidget::style((QWidget *)this);
            iVar8 = (**(code **)(*(long *)pQVar11 + 0xf0))(pQVar11,0x3d,0,this,0);
            if (iVar8 == 0) {
              QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&me,&persistent);
              activated(this,(QModelIndex *)&me);
            }
          }
        }
        *(undefined1 *)(lVar4 + 0x3a5) = 1;
        QPersistentModelIndex::~QPersistentModelIndex(&persistent);
        goto LAB_004e3d1a;
      }
    }
  }
  _me = &DAT_aaaaaaaaaaaaaaaa;
  QVar12 = QSinglePointEvent::position((QSinglePointEvent *)event);
  persistent.d = (QPersistentModelIndexData *)QVar12.xp;
  QVar12 = QSinglePointEvent::scenePosition((QSinglePointEvent *)event);
  local_c0 = QVar12.yp;
  local_c8 = QVar12.xp;
  QVar12 = QSinglePointEvent::globalPosition((QSinglePointEvent *)event);
  local_d0 = QVar12.yp;
  local_d8 = QVar12.xp;
  uVar1 = *(undefined4 *)(event + 0x20);
  uVar2 = *(undefined4 *)(event + 0x40);
  uVar3 = *(undefined4 *)(event + 0x44);
  uVar7 = QMouseEvent::source();
  uVar10 = QPointerEvent::pointingDevice();
  QMouseEvent::QMouseEvent(&me,2,&persistent,&local_c8,&local_d8,uVar2,uVar3,uVar1,uVar7,uVar10);
  (**(code **)(*(long *)this + 0x98))(this,&me);
  QMouseEvent::~QMouseEvent(&me);
LAB_004e3d1a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::mouseDoubleClickEvent(QMouseEvent *event)
{
    Q_D(QAbstractItemView);

    QModelIndex index = indexAt(event->position().toPoint());
    if (!index.isValid()
        || !d->isIndexEnabled(index)
        || (d->pressedIndex != index)) {
        QMouseEvent me(QEvent::MouseButtonPress,
                       event->position(), event->scenePosition(), event->globalPosition(),
                       event->button(), event->buttons(), event->modifiers(),
                       event->source(), event->pointingDevice());
        mousePressEvent(&me);
        return;
    }
    // signal handlers may change the model
    QPersistentModelIndex persistent = index;
    emit doubleClicked(persistent);
    if ((event->button() == Qt::LeftButton) && !edit(persistent, DoubleClicked, event)
        && !style()->styleHint(QStyle::SH_ItemView_ActivateItemOnSingleClick, nullptr, this))
        emit activated(persistent);
    d->releaseFromDoubleClick = true;
}